

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pDistinct,u16 wctrlFlags,int iIdxCur)

{
  WhereLevel *pWVar1;
  uint *__s;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  Vdbe *pVVar5;
  sqlite3 *db;
  Table *pTVar6;
  Vdbe *p;
  Op *pOVar7;
  Parse *pParse_00;
  SrcList *pSVar8;
  sqlite3_index_info *psVar9;
  sqlite3_index_constraint_usage *psVar10;
  sqlite3_index_constraint *psVar11;
  tRowcnt *ptVar12;
  SrcList *pSVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined8 zAff;
  char cVar16;
  char cVar17;
  u8 uVar18;
  u16 uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int p3;
  WhereInfo *pWInfo;
  WhereTerm *pWVar29;
  KeyInfo *pKVar30;
  Vdbe *p_00;
  Index *pIVar31;
  CollSeq *pCVar32;
  int *piVar33;
  WhereTerm *pWVar34;
  char *pcVar35;
  SrcList *pSVar36;
  Expr *pEVar37;
  Expr *pEVar38;
  WhereInfo *pWInfo_00;
  int iVar39;
  ExprList *pList;
  long lVar40;
  long lVar41;
  WhereTerm *pWVar42;
  ulong uVar43;
  uint uVar44;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  Schema **ppSVar45;
  VTable *zP4;
  byte *pbVar46;
  uint uVar47;
  WhereLevel *pWVar48;
  ulong uVar49;
  int iVar50;
  ExprList_item *pEVar51;
  SrcList_item *pSVar52;
  Expr *pEVar53;
  SrcList_item *pSVar54;
  SrcList *pSVar55;
  byte *pbVar56;
  byte bVar57;
  uint uVar58;
  int iTerm;
  long lVar59;
  WhereClause *pWVar60;
  code aff2;
  int iVar61;
  ulong uVar62;
  Index *pIVar63;
  u8 *puVar64;
  bool bVar65;
  byte bVar66;
  uint uVar67;
  uint uVar69;
  ulong uVar68;
  uint uVar70;
  uint uVar71;
  uint uVar73;
  ulong uVar72;
  uint uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  uint uVar78;
  uint uVar80;
  uint uVar81;
  undefined1 auVar79 [16];
  uint uVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  ulong uVar85;
  ulong uVar86;
  char *zStartAff;
  double local_1e8;
  int local_1e0;
  double local_1d8;
  anon_union_8_3_b4c78fbb_for_u local_1d0;
  SrcList *local_1a8;
  ulong local_190;
  Index *local_188;
  WhereTerm *local_158;
  undefined1 local_138 [16];
  WhereBestIdx local_f0;
  Expr local_78;
  
  bVar66 = 0;
  pVVar5 = pParse->pVdbe;
  local_f0.cost.plan.u.pIdx = (Index *)0x0;
  local_f0.cost.rCost = 0.0;
  local_f0.cost.plan.wsFlags = 0;
  local_f0.cost.plan.nEq = 0;
  local_f0.cost.plan.nOBSat = 0;
  local_f0.cost.plan.nRow = 0.0;
  local_f0.i = 0;
  local_f0.n = 0;
  local_f0.aLevel = (WhereLevel *)0x0;
  local_f0.pDistinct = (ExprList *)0x0;
  local_f0.ppIdxInfo = (sqlite3_index_info **)0x0;
  local_f0.notValid = 0;
  local_f0.pOrderBy = (ExprList *)0x0;
  local_f0.pSrc = (SrcList_item *)0x0;
  local_f0.notReady = 0;
  local_f0.cost.used = 0;
  local_f0.pParse = pParse;
  if (0x40 < pTabList->nSrc) {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
    return (WhereInfo *)0x0;
  }
  uVar14 = (int)pTabList->nSrc;
  if ((wctrlFlags & 0x40) != 0) {
    uVar14 = 1;
  }
  db = pParse->db;
  uVar62 = (long)(int)(uVar14 * 0x60 + 0x47) & 0xffffffffffffffe0;
  iVar50 = (int)uVar62 + 0x2f4;
  pWInfo = (WhereInfo *)sqlite3DbMallocRaw(db,iVar50);
  if (pWInfo != (WhereInfo *)0x0) {
    memset(pWInfo,0,(long)iVar50);
  }
  if (db->mallocFailed != '\0') {
    sqlite3DbFree(db,pWInfo);
    return (WhereInfo *)0x0;
  }
  pWInfo->nLevel = uVar14;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  iVar50 = sqlite3VdbeMakeLabel(pVVar5);
  pWInfo->iBreak = iVar50;
  pWVar60 = (WhereClause *)((long)pWInfo->a + (uVar62 - 0x40));
  pWInfo->pWC = pWVar60;
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  __s = (uint *)((long)pWInfo[3].a + (uVar62 - 0x30));
  pWVar1 = pWInfo->a;
  pList = (ExprList *)0x0;
  if ((db->dbOptFlags & 0x20) == 0) {
    pList = pDistinct;
  }
  local_f0.pWC = pWVar60;
  local_f0.aLevel = pWVar1;
  memset(__s,0,0x104);
  *(Parse **)((long)pWInfo->a + (uVar62 - 0x40)) = pParse;
  *(uint **)((long)pWInfo->a + (uVar62 - 0x38)) = __s;
  *(undefined8 *)((long)pWInfo->a + (uVar62 - 0x30)) = 0;
  *(undefined8 *)((long)pWInfo->a + (uVar62 - 0x24)) = 0x800000000;
  *(ulong *)((long)pWInfo->a + (uVar62 - 0x18)) = (long)pWInfo->a + (uVar62 - 0x10);
  *(u16 *)((long)pWInfo->a + (uVar62 - 0x26)) = wctrlFlags;
  if ((pParse->cookieGoto == 0) && ((pParse->db->dbOptFlags & 8) == 0)) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78._0_8_ = evalConstExpr;
    local_78.pLeft = (Expr *)pParse;
    sqlite3WalkExpr((Walker *)&local_78,pWhere);
  }
  whereSplit(pWVar60,pWhere,0x45);
  uVar62 = extraout_RDX;
  if (pWhere != (Expr *)0x0) {
    if (uVar14 != 0) {
      local_78.pLeft = (Expr *)0x0;
      local_78.pRight = (Expr *)0x0;
      local_78.x = (anon_union_8_2_a01b6dbf_for_x)0x3;
      local_78._0_8_ = exprNodeIsConstant;
      local_78.u.zToken = (char *)selectNodeIsConstant;
      sqlite3WalkExpr((Walker *)&local_78,pWhere);
      uVar62 = extraout_RDX_00;
      if (local_78.x._0_4_ == 0) goto LAB_0018d75c;
    }
    sqlite3ExprIfFalse(pParse,pWhere,pWInfo->iBreak,8);
    uVar62 = extraout_RDX_01;
  }
LAB_0018d75c:
  sVar2 = pTabList->nSrc;
  if (0 < (long)sVar2) {
    lVar40 = 0;
    do {
      uVar47 = *(uint *)((long)&pTabList->a[0].iCursor + lVar40);
      uVar62 = (ulong)uVar47;
      iVar50 = *(int *)&pWVar60[1].pParse;
      *(int *)&pWVar60[1].pParse = iVar50 + 1;
      *(uint *)((long)pWVar60[1].aStatic + (long)iVar50 * 4 + -0x2c) = uVar47;
      lVar40 = lVar40 + 0x68;
    } while ((long)sVar2 * 0x68 - lVar40 != 0);
  }
  if (0 < pWVar60->nTerm) {
    uVar47 = pWVar60->nTerm + 1;
    do {
      exprAnalyze((SrcList *)pWVar60,(WhereClause *)(ulong)(uVar47 - 2),(int)uVar62);
      uVar47 = uVar47 - 1;
      uVar62 = extraout_RDX_02;
    } while (1 < uVar47);
  }
  if (db->mallocFailed != '\0') goto LAB_0018dee2;
  if (pList == (ExprList *)0x0) {
    pDistinct = (ExprList *)0x0;
  }
  else if (pTabList->nSrc == 1) {
    iVar50 = pTabList->a[0].iCursor;
    pTVar6 = pTabList->a[0].pTab;
    if (0 < (long)pList->nExpr) {
      lVar40 = 0;
      do {
        pEVar51 = pList->a + lVar40;
        while( true ) {
          pEVar38 = pEVar51->pExpr;
          uVar18 = pEVar38->op;
          if ((uVar18 != '\x18') && (uVar18 != '\\')) break;
          pEVar51 = (ExprList_item *)&pEVar38->pLeft;
        }
        if ((uVar18 == 0x98) && ((pEVar38->iTable == iVar50 && (pEVar38->iColumn < 0))))
        goto LAB_0018d917;
        lVar40 = lVar40 + 1;
      } while (lVar40 != pList->nExpr);
    }
    for (pIVar31 = pTVar6->pIndex; pDistinct = pList, pIVar31 != (Index *)0x0;
        pIVar31 = pIVar31->pNext) {
      if (pIVar31->onError != '\0') {
        if (pIVar31->nColumn == 0) goto LAB_0018d917;
        uVar62 = 0;
        do {
          pWVar29 = findTerm(pWVar60,iVar50,pIVar31->aiColumn[uVar62],0xffffffffffffffff,2,pIVar31);
          if ((pWVar29 == (WhereTerm *)0x0) &&
             ((iVar20 = findIndexCol(pParse,pList,iVar50,pIVar31,(int)uVar62), iVar20 < 0 ||
              (pTVar6->aCol[pIVar31->aiColumn[uVar62]].notNull == '\0')))) {
            uVar3 = pIVar31->nColumn;
            break;
          }
          uVar62 = uVar62 + 1;
          uVar3 = pIVar31->nColumn;
        } while (uVar62 < uVar3);
        if ((uint)uVar62 == (uint)uVar3) goto LAB_0018d917;
      }
    }
  }
LAB_0018d927:
  local_f0.notValid = 0xffffffffffffffff;
  local_f0._64_8_ = (ulong)uVar14 << 0x20;
  pWVar48 = pWVar1;
  local_f0.pOrderBy = pOrderBy;
  local_f0.pDistinct = pDistinct;
  if ((int)uVar14 < 1) {
    bVar57 = 1;
  }
  else {
    uVar58 = 0xffffffff;
    uVar47 = 0;
    do {
      local_1e0 = 0;
      uVar21 = uVar14 - 1;
      uVar62 = local_f0.notValid;
      if (uVar47 == uVar14 - 1) {
LAB_0018d9b1:
        uVar47 = uVar21;
        lVar40 = (long)(int)uVar47;
        local_138 = ZEXT816(0);
        local_1d8 = 0.0;
        iVar50 = -1;
        iVar61 = 0;
        local_1e8 = 1e+99;
        local_1d0.pIdx = (Index *)0x0;
        local_190 = 0;
        iVar20 = local_1e0;
        do {
          local_f0.pSrc = pTabList->a + lVar40;
          lVar59 = lVar40;
          if ((int)uVar47 < (int)uVar14) {
            do {
              if ((lVar40 < lVar59) && (((local_f0.pSrc)->jointype & 10) != 0)) break;
              if (0 < (long)(int)*__s) {
                lVar41 = 0;
                do {
                  if (*(int *)((long)pWVar60[1].aStatic + lVar41 * 4 + -0x2c) ==
                      (local_f0.pSrc)->iCursor) {
                    uVar43 = 1L << ((byte)lVar41 & 0x3f);
                    goto LAB_0018da63;
                  }
                  lVar41 = lVar41 + 1;
                } while ((int)*__s != lVar41);
              }
              uVar43 = 0;
LAB_0018da63:
              if ((uVar62 & uVar43) != 0) {
                local_f0.notReady = uVar43;
                if (iVar20 == 0) {
                  local_f0.notReady = uVar62;
                }
                iVar61 = iVar61 + (uint)((local_f0.pSrc)->pIndex == (Index *)0x0);
                if (((local_f0.pSrc)->pTab->tabFlags & 0x10) == 0) {
                  bestBtreeIndex(&local_f0);
                }
                else {
                  local_f0.ppIdxInfo = &pWVar1[lVar59].pIdxInfo;
                  bestVirtualIndex(&local_f0);
                }
                if (iVar20 == 0) {
                  if (local_1e0 != 0) {
                    local_f0.cost.rCost = local_f0.cost.rCost / pWInfo->a[lVar59].rOptCost;
                  }
                }
                else {
                  pWInfo->a[lVar59].rOptCost = local_f0.cost.rCost;
                }
                if (((local_f0.cost.used & local_f0.notValid) == 0) &&
                   (((iVar61 == 0 || ((local_f0.pSrc)->pIndex == (Index *)0x0)) ||
                    ((local_f0.cost.plan._0_8_ & 0x100f3000) != 0)))) {
                  if ((iVar50 < 0) || (local_f0.cost.rCost < local_1e8)) {
LAB_0018dbb0:
                    local_190 = local_f0.cost.plan._0_8_ & 0xffffffff;
                    local_138 = ZEXT416((uint)local_f0.cost.plan._4_4_);
                    local_1d8 = local_f0.cost.plan.nRow;
                    local_1d0 = local_f0.cost.plan.u;
                    local_1e8 = local_f0.cost.rCost;
                    iVar50 = (int)lVar59;
                  }
                  else if (local_f0.cost.rCost <= local_1e8) {
                    if (((ushort)local_138._2_2_ < local_f0.cost.plan.nOBSat) ||
                       (local_f0.cost.plan.nRow < local_1d8)) goto LAB_0018dbb0;
                  }
                }
                uVar62 = local_f0.notValid;
                if (((local_f0.pSrc)->jointype & 8) != 0) break;
              }
              lVar59 = lVar59 + 1;
              local_f0.pSrc = local_f0.pSrc + 1;
            } while (uVar14 != (uint)lVar59);
          }
        } while ((0 < iVar20) && (iVar20 = iVar20 + -1, iVar50 < 0));
        if (((uint)local_190 >> 0x1e & 1) != 0) {
          pWInfo->eDistinct = '\x02';
        }
      }
      else {
        local_f0.pSrc = pTabList->a + (int)uVar47;
        if ((int)uVar47 < (int)uVar14) {
          local_1e0 = -1;
          uVar21 = uVar47;
          do {
            if (0 < (int)*__s) {
              uVar43 = 0;
              do {
                if (*(int *)((long)pWVar60[1].aStatic + uVar43 * 4 + -0x2c) ==
                    (local_f0.pSrc)->iCursor) {
                  uVar43 = 1L << ((byte)uVar43 & 0x3f);
                  goto LAB_0018dcbe;
                }
                uVar43 = uVar43 + 1;
              } while (*__s != uVar43);
            }
            uVar43 = 0;
LAB_0018dcbe:
            if ((local_f0.notValid & uVar43) == 0) {
              uVar21 = uVar21 + (uVar47 == uVar21);
              iVar50 = local_1e0;
            }
            else {
              if (((int)uVar21 < (int)uVar47) && (((local_f0.pSrc)->jointype & 10) != 0)) break;
              if (local_1e0 != -1) {
                local_1e0 = 1;
                goto LAB_0018d9b1;
              }
              local_1e0 = 0;
              iVar50 = 0;
              if (((local_f0.pSrc)->jointype & 8) != 0) goto LAB_0018d9b1;
            }
            local_1e0 = iVar50;
            uVar47 = uVar47 + 1;
            local_f0.pSrc = local_f0.pSrc + 1;
          } while (uVar47 != uVar14);
          uVar47 = uVar21;
          uVar21 = uVar47;
          if (-1 < local_1e0) goto LAB_0018d9b1;
          local_138._0_4_ = 0;
          local_1d0.pIdx = (Index *)0x0;
          local_1d8 = 0.0;
          iVar50 = -1;
          local_190 = 0;
        }
        else {
          local_138._0_4_ = 0;
          local_1d0.pIdx = (Index *)0x0;
          local_1d8 = 0.0;
          iVar50 = -1;
          local_190 = 0;
        }
      }
      (pWVar48->plan).wsFlags = (uint)local_190;
      (pWVar48->plan).nEq = local_138._0_2_;
      (pWVar48->plan).nOBSat = local_138._2_2_;
      (pWVar48->plan).nRow = local_1d8;
      (pWVar48->plan).u.pIdx = (Index *)local_1d0;
      iVar20 = pTabList->a[iVar50].iCursor;
      pWVar48->iTabCur = iVar20;
      if ((local_190 & 0x200f0000) == 0) {
        iVar61 = -1;
      }
      else if (((wctrlFlags & 0x40) == 0) || (iVar61 = iIdxCur, (local_190 & 0x20000000) != 0)) {
        iVar61 = pParse->nTab;
        pParse->nTab = iVar61 + 1;
      }
      pWVar48->iIdxCur = iVar61;
      local_f0.notValid = 0xffffffffffffffff;
      if (0 < (long)(int)*__s) {
        lVar40 = 0;
        do {
          if (*(int *)((long)pWVar60[1].aStatic + lVar40 * 4 + -0x2c) == iVar20) {
            bVar57 = (byte)lVar40 & 0x3f;
            local_f0.notValid = -2L << bVar57 | 0xfffffffffffffffeU >> 0x40 - bVar57;
            break;
          }
          lVar40 = lVar40 + 1;
        } while ((int)*__s != lVar40);
      }
      local_f0.notValid = uVar62 & local_f0.notValid;
      pWVar48->iFrom = (u8)iVar50;
      if (1.0 <= local_1d8) {
        pParse->nQueryLoop = local_1d8 * pParse->nQueryLoop;
      }
      pIVar31 = pTabList->a[iVar50].pIndex;
      if ((pIVar31 != (Index *)0x0) && ((local_190 & 0xf0000) == 0)) {
        sqlite3ErrorMsg(pParse,"cannot use index: %s",pIVar31->zName);
        goto LAB_0018dee2;
      }
      uVar58 = uVar58 & (uint)local_190;
      iVar50 = local_f0.i + 1;
      local_f0.i = iVar50;
      pWVar48 = pWVar48 + 1;
    } while (iVar50 < (int)uVar14);
    bVar57 = (byte)(uVar58 >> 0x19) & 1;
  }
  if ((pParse->nErr == 0) && (db->mallocFailed == '\0')) {
    if (uVar14 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = *(u16 *)((long)(pWVar48 + -1) + 6);
    }
    pWInfo->nOBSat = uVar19;
    if (pOrderBy != (ExprList *)0x0 && (bVar57 ^ 1) == 0) {
      pWInfo->nOBSat = (u16)pOrderBy->nExpr;
    }
    if ((wctrlFlags & 4) != 0 && (bVar57 ^ 1) == 0) {
      pWInfo->okOnePass = '\x01';
      pbVar46 = (byte *)((long)&pWInfo->a[0].plan.wsFlags + 2);
      *pbVar46 = *pbVar46 & 0xbf;
    }
    sqlite3CodeVerifySchema(pParse,-1);
    pWInfo->nRowOut = 1.0;
    if ((int)uVar14 < 1) {
      pWInfo->iTop = pVVar5->nOp;
      if (db->mallocFailed == '\0') {
        return pWInfo;
      }
    }
    else {
      uVar47 = 0;
      local_138._0_8_ = 0xffffffffffffffff;
      pWVar48 = pWVar1;
      do {
        bVar57 = pWVar48->iFrom;
        pTVar6 = pTabList->a[bVar57].pTab;
        pWInfo->nRowOut = (pWVar48->plan).nRow * pWInfo->nRowOut;
        if (pTVar6->pSchema == (Schema *)0x0) {
          uVar62 = 0xfff0bdc0;
        }
        else {
          uVar58 = db->nDb;
          if ((int)uVar58 < 1) {
            uVar62 = 0;
          }
          else {
            ppSVar45 = &db->aDb->pSchema;
            uVar62 = 0;
            do {
              if (*ppSVar45 == pTVar6->pSchema) goto LAB_0018e03c;
              uVar62 = uVar62 + 1;
              ppSVar45 = ppSVar45 + 4;
            } while (uVar58 != uVar62);
            uVar62 = (ulong)uVar58;
          }
        }
LAB_0018e03c:
        pSVar52 = pTabList->a + bVar57;
        iVar50 = (int)uVar62;
        if (((pTVar6->tabFlags & 2) == 0) && (pTVar6->pSelect == (Select *)0x0)) {
          uVar58 = (pWVar48->plan).wsFlags;
          if ((uVar58 >> 0x1b & 1) == 0) {
            if ((pTVar6->tabFlags & 0x10) == 0) {
              if ((uVar58 & 0x400000) == 0 && (wctrlFlags & 0x10) == 0) {
                sqlite3OpenTable(pParse,pSVar52->iCursor,iVar50,pTVar6,
                                 0x28 - (uint)(pWInfo->okOnePass == '\0'));
                if ((pWInfo->okOnePass == '\0') && (pTVar6->nCol < 0x40)) {
                  uVar62 = pSVar52->colUsed;
                  uVar43 = 0x3f;
                  if (uVar62 != 0) {
                    for (; uVar62 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                    }
                  }
                  zP4 = (VTable *)((uVar43 ^ 0xffffffffffffffc0) + 0x41);
                  if (uVar62 == 0) {
                    zP4 = (VTable *)0x0;
                  }
                  iVar20 = pVVar5->nOp + -1;
                  iVar61 = -0xe;
                  goto LAB_0018e0d8;
                }
              }
              else {
                sqlite3TableLock(pParse,iVar50,pTVar6->tnum,'\0',pTVar6->zName);
              }
            }
          }
          else {
            for (zP4 = pTVar6->pVTable; zP4 != (VTable *)0x0; zP4 = zP4->pNext) {
              if (zP4->db == db) goto LAB_0018e0ac;
            }
            zP4 = (VTable *)0x0;
LAB_0018e0ac:
            iVar20 = sqlite3VdbeAddOp3(pVVar5,0x87,pSVar52->iCursor,0,0);
            iVar61 = -10;
LAB_0018e0d8:
            sqlite3VdbeChangeP4(pVVar5,iVar20,(char *)zP4,iVar61);
          }
        }
        pWVar60 = local_f0.pWC;
        uVar58 = (pWVar48->plan).wsFlags;
        if ((uVar58 >> 0x1d & 1) == 0) {
          if ((uVar58 & 0xf0000) != 0) {
            pIVar31 = (pWVar48->plan).u.pIdx;
            pKVar30 = sqlite3IndexKeyinfo(pParse,pIVar31);
            iVar20 = sqlite3VdbeAddOp3(pVVar5,0x27,pWVar48->iIdxCur,pIVar31->tnum,iVar50);
            sqlite3VdbeChangeP4(pVVar5,iVar20,(char *)pKVar30,-0x10);
          }
        }
        else {
          p = pParse->pVdbe;
          p_00 = sqlite3GetVdbe(pParse);
          iVar20 = pParse->nOnce;
          pParse->nOnce = iVar20 + 1;
          uVar58 = 0;
          uVar21 = sqlite3VdbeAddOp3(p_00,0x1a,iVar20,0,0);
          pTVar6 = pSVar52->pTab;
          pWVar29 = pWVar60->a;
          pWVar42 = pWVar29 + pWVar60->nTerm;
          if ((long)pWVar60->nTerm < 1) {
            uVar62 = 0xffffffffffffffff;
          }
          else {
            uVar58 = 0;
            uVar62 = 0;
            do {
              iVar20 = termCanDriveIndex(pWVar29,pSVar52,local_138._0_8_);
              if (iVar20 != 0) {
                uVar43 = 1L << ((byte)(pWVar29->u).leftColumn & 0x3f);
                if (0x3f < (pWVar29->u).leftColumn) {
                  uVar43 = 0x8000000000000000;
                }
                bVar65 = (uVar43 & uVar62) == 0;
                if (!bVar65) {
                  uVar43 = 0;
                }
                uVar62 = uVar62 | uVar43;
                uVar58 = uVar58 + bVar65;
              }
              pWVar29 = pWVar29 + 1;
            } while (pWVar29 < pWVar42);
            uVar62 = ~uVar62 | 0x8000000000000000;
          }
          (pWVar48->plan).nEq = (u16)uVar58;
          uVar43 = pSVar52->colUsed;
          uVar62 = uVar62 & uVar43;
          uVar22 = (uint)pTVar6->nCol;
          uVar24 = uVar22;
          if (0x3e < (int)uVar22) {
            uVar24 = 0x3f;
          }
          if (0 < (int)uVar24) {
            uVar49 = (ulong)(uVar24 + 3 & 0xfffffffc);
            lVar40 = (ulong)uVar24 - 1;
            auVar75._8_4_ = (int)lVar40;
            auVar75._0_8_ = lVar40;
            auVar75._12_4_ = (int)((ulong)lVar40 >> 0x20);
            auVar79._8_4_ = (int)uVar62;
            auVar79._0_8_ = uVar62;
            auVar79._12_4_ = (int)(uVar62 >> 0x20);
            auVar83 = _DAT_001aa8a0;
            auVar84 = _DAT_001aa890;
            uVar44 = 0;
            uVar71 = 0;
            uVar74 = 0;
            do {
              uVar73 = uVar74;
              uVar70 = uVar71;
              uVar69 = uVar44;
              uVar67 = uVar58;
              auVar77 = auVar84;
              auVar76 = auVar83;
              uVar85 = 1L << auVar77._0_8_ & uVar62;
              uVar86 = 1L << auVar77._8_8_ & auVar79._8_8_;
              uVar68 = 1L << auVar76._0_8_ & uVar62;
              uVar72 = 1L << auVar76._8_8_ & auVar79._8_8_;
              uVar58 = (uVar67 - ((int)(uVar68 >> 0x20) == 0 && (int)uVar68 == 0)) + 1;
              uVar44 = (uVar69 - ((int)uVar72 == 0 && (int)(uVar72 >> 0x20) == 0)) + 1;
              uVar71 = (uVar70 - ((int)(uVar85 >> 0x20) == 0 && (int)uVar85 == 0)) + 1;
              uVar74 = (uVar73 - ((int)uVar86 == 0 && (int)(uVar86 >> 0x20) == 0)) + 1;
              auVar83._0_8_ = auVar76._0_8_ + 4;
              auVar83._8_8_ = auVar76._8_8_ + 4;
              auVar84._0_8_ = auVar77._0_8_ + 4;
              auVar84._8_8_ = auVar77._8_8_ + 4;
              uVar49 = uVar49 - 4;
            } while (uVar49 != 0);
            auVar75 = auVar75 ^ _DAT_001aa8b0;
            auVar76 = auVar76 ^ _DAT_001aa8b0;
            iVar20 = auVar75._4_4_;
            iVar61 = auVar75._12_4_;
            auVar77 = auVar77 ^ _DAT_001aa8b0;
            uVar78 = -(uint)(iVar20 < auVar76._4_4_ ||
                            auVar76._4_4_ == iVar20 && auVar75._0_4_ < auVar76._0_4_);
            uVar80 = -(uint)(iVar61 < auVar76._12_4_ ||
                            auVar76._12_4_ == iVar61 && auVar75._8_4_ < auVar76._8_4_);
            uVar81 = -(uint)(iVar20 < auVar77._4_4_ ||
                            auVar77._4_4_ == iVar20 && auVar75._0_4_ < auVar77._0_4_);
            uVar82 = -(uint)(iVar61 < auVar77._12_4_ ||
                            auVar77._12_4_ == iVar61 && auVar75._8_4_ < auVar77._8_4_);
            uVar58 = (~uVar82 & uVar74 | uVar73 & uVar82) + (~uVar80 & uVar44 | uVar69 & uVar80) +
                     (~uVar81 & uVar71 | uVar70 & uVar81) + (~uVar78 & uVar58 | uVar67 & uVar78);
          }
          (pWVar48->plan).wsFlags = (pWVar48->plan).wsFlags | 0x410002;
          iVar61 = ((uint)((long)uVar43 >> 0x3f) & uVar22 - 0x3f) + uVar58;
          iVar20 = iVar61 * 0xd + 0x50;
          pIVar31 = (Index *)sqlite3DbMallocRaw(pParse->db,iVar20);
          if (pIVar31 != (Index *)0x0) {
            iVar23 = 0;
            memset(pIVar31,0,(long)iVar20);
            (pWVar48->plan).u.pIdx = pIVar31;
            pIVar31->azColl = &pIVar31[1].zName;
            pIVar31->aiColumn = (int *)(&pIVar31[1].zName + iVar61);
            pIVar31->aSortOrder = (u8 *)((long)(&pIVar31[1].zName + iVar61) + (long)iVar61 * 4);
            pIVar31->zName = "auto-index";
            pIVar31->nColumn = (u16)iVar61;
            pIVar31->pTable = pTVar6;
            pWVar29 = pWVar60->a;
            if (pWVar29 < pWVar42) {
              iVar23 = 0;
              local_1d8 = 0.0;
              do {
                iVar20 = termCanDriveIndex(pWVar29,pSVar52,local_138._0_8_);
                if (iVar20 != 0) {
                  iVar20 = (pWVar29->u).leftColumn;
                  uVar43 = 1L << ((byte)iVar20 & 0x3f);
                  if (0x3f < iVar20) {
                    uVar43 = 0x8000000000000000;
                  }
                  if (((ulong)local_1d8 & uVar43) == 0) {
                    pEVar38 = pWVar29->pExpr;
                    pIVar31->aiColumn[iVar23] = iVar20;
                    pCVar32 = sqlite3BinaryCompareCollSeq(pParse,pEVar38->pLeft,pEVar38->pRight);
                    pcVar35 = "BINARY";
                    if (pCVar32 != (CollSeq *)0x0) {
                      pcVar35 = pCVar32->zName;
                    }
                    local_1d8 = (double)((ulong)local_1d8 | uVar43);
                    pIVar31->azColl[iVar23] = pcVar35;
                    iVar23 = iVar23 + 1;
                  }
                }
                pWVar29 = pWVar29 + 1;
              } while (pWVar29 < pWVar42);
            }
            if (0 < (int)uVar24) {
              uVar43 = 0;
              do {
                if ((uVar62 >> (uVar43 & 0x3f) & 1) != 0) {
                  pIVar31->aiColumn[iVar23] = (int)uVar43;
                  pIVar31->azColl[iVar23] = "BINARY";
                  iVar23 = iVar23 + 1;
                }
                uVar43 = uVar43 + 1;
              } while (uVar24 != uVar43);
            }
            if (((long)pSVar52->colUsed < 0) && (sVar2 = pTVar6->nCol, 0x3f < sVar2)) {
              lVar40 = (long)iVar23;
              iVar20 = 0x3f;
              do {
                pIVar31->aiColumn[lVar40] = iVar20;
                pIVar31->azColl[lVar40] = "BINARY";
                lVar40 = lVar40 + 1;
                iVar20 = iVar20 + 1;
              } while (sVar2 != iVar20);
            }
            pKVar30 = sqlite3IndexKeyinfo(pParse,pIVar31);
            iVar20 = sqlite3VdbeAddOp3(p,0x29,pWVar48->iIdxCur,iVar61 + 1,0);
            sqlite3VdbeChangeP4(p,iVar20,(char *)pKVar30,-0x10);
            uVar58 = sqlite3VdbeAddOp3(p,0x48,pWVar48->iTabCur,0,0);
            if (pParse->nTempReg == '\0') {
              iVar20 = pParse->nMem + 1;
              pParse->nMem = iVar20;
            }
            else {
              bVar57 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar57;
              iVar20 = pParse->aTempReg[bVar57];
            }
            sqlite3GenerateIndexKey(pParse,pIVar31,pWVar48->iTabCur,iVar20,1);
            sqlite3VdbeAddOp3(p,0x61,pWVar48->iIdxCur,iVar20,0);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\x10';
            }
            sqlite3VdbeAddOp3(p,0x5f,pWVar48->iTabCur,uVar58 + 1,0);
            pOVar7 = p->aOp;
            if (pOVar7 != (Op *)0x0) {
              pOVar7[(long)p->nOp + -1].p5 = '\x03';
            }
            if ((-1 < (int)uVar58) && (uVar58 < (uint)p->nOp)) {
              pOVar7[uVar58].p2 = p->nOp;
            }
            if (iVar20 != 0) {
              bVar57 = pParse->nTempReg;
              if ((ulong)bVar57 < 8) {
                lVar40 = 0;
                do {
                  if (*(int *)((long)&pParse->aColCache[0].iReg + lVar40) == iVar20) {
                    (&pParse->aColCache[0].tempReg)[lVar40] = '\x01';
                    goto LAB_0018e6a9;
                  }
                  lVar40 = lVar40 + 0x18;
                } while ((int)lVar40 != 0xf0);
                pParse->nTempReg = bVar57 + 1;
                pParse->aTempReg[bVar57] = iVar20;
              }
            }
LAB_0018e6a9:
            if ((-1 < (int)uVar21) && (uVar21 < (uint)p->nOp)) {
              pOVar7[uVar21].p2 = p->nOp;
            }
          }
        }
        sqlite3CodeVerifySchema(pParse,iVar50);
        lVar40 = (long)(local_f0.pWC)->pMaskSet->n;
        uVar62 = 0xffffffffffffffff;
        if (0 < lVar40) {
          lVar59 = 0;
          do {
            if ((local_f0.pWC)->pMaskSet->ix[lVar59] == pSVar52->iCursor) {
              bVar57 = (byte)lVar59 & 0x3f;
              uVar62 = -2L << bVar57 | 0xfffffffffffffffeU >> 0x40 - bVar57;
              break;
            }
            lVar59 = lVar59 + 1;
          } while (lVar40 != lVar59);
        }
        local_138._0_8_ = local_138._0_8_ & uVar62;
        uVar47 = uVar47 + 1;
        pWVar48 = pWVar48 + 1;
      } while (uVar47 != uVar14);
      pWInfo->iTop = pVVar5->nOp;
      if (db->mallocFailed == '\0') {
        if ((int)uVar14 < 1) {
          return pWInfo;
        }
        pbVar46 = (byte *)((long)&pWInfo[1].savedNQueryLoop + 4);
        uVar62 = 0xffffffffffffffff;
        uVar43 = 0;
        iVar50 = 0;
        do {
          pWVar48 = pWVar1 + uVar43;
          iVar25 = (int)uVar43;
          explainOneScan(pParse,pTabList,pWVar48,iVar25,(uint)pWInfo->a[uVar43].iFrom,wctrlFlags);
          pParse_00 = pWInfo->pParse;
          pSVar8 = pWInfo->pTabList;
          pVVar5 = pParse_00->pVdbe;
          pWVar60 = pWInfo->pWC;
          bVar57 = pWInfo->a[uVar43].iFrom;
          iVar20 = pSVar8->a[bVar57].iCursor;
          uVar47 = pWVar1[uVar43].plan.wsFlags;
          iVar61 = sqlite3VdbeMakeLabel(pVVar5);
          pWInfo->a[uVar43].addrNxt = iVar61;
          pWInfo->a[uVar43].addrBrk = iVar61;
          iVar23 = sqlite3VdbeMakeLabel(pVVar5);
          pWInfo->a[uVar43].addrCont = iVar23;
          if ((pWInfo->a[uVar43].iFrom != '\0') && ((pSVar8->a[bVar57].jointype & 8) != 0)) {
            iVar39 = pParse_00->nMem + 1;
            pParse_00->nMem = iVar39;
            pWVar48->iLeftJoin = iVar39;
            sqlite3VdbeAddOp3(pVVar5,7,0,iVar39,0);
          }
          if ((pSVar8->a[bVar57].field_0x39 & 4) == 0) {
            uVar58 = (pWVar48->plan).wsFlags;
            if ((uVar58 >> 0x1b & 1) != 0) {
              psVar9 = (pWVar48->plan).u.pVtabIdx;
              uVar47 = psVar9->nConstraint;
              psVar10 = psVar9->aConstraintUsage;
              psVar11 = psVar9->aConstraint;
              pParse_00->iCacheLevel = pParse_00->iCacheLevel + 1;
              iVar61 = uVar47 + 2;
              if (pParse_00->nRangeReg < iVar61) {
                iVar25 = pParse_00->nMem + 1;
                pParse_00->nMem = pParse_00->nMem + iVar61;
              }
              else {
                iVar25 = pParse_00->iRangeReg;
                pParse_00->iRangeReg = iVar25 + iVar61;
                pParse_00->nRangeReg = pParse_00->nRangeReg - iVar61;
              }
              iVar39 = pWVar48->addrBrk;
              if ((int)uVar47 < 1) {
                iVar26 = 0;
              }
              else {
                uVar58 = 1;
                do {
                  uVar49 = 0;
                  piVar33 = &psVar11->iTermOffset;
                  while (uVar21 = uVar58, psVar10[uVar49].argvIndex != uVar58) {
                    uVar49 = uVar49 + 1;
                    piVar33 = piVar33 + 3;
                    if (uVar47 == uVar49) goto LAB_0018eba6;
                  }
                  iVar26 = iVar25 + 1 + uVar58;
                  pWVar29 = pWVar60->a + *piVar33;
                  if ((pWVar60->a[*piVar33].eOperator & 1) == 0) {
                    sqlite3ExprCode(pParse_00,pWVar29->pExpr->pRight,iVar26);
                  }
                  else {
                    codeEqualityTerm(pParse_00,pWVar29,pWVar48,(uint)uVar49,iVar26);
                    iVar39 = pWVar48->addrNxt;
                  }
                } while ((uVar47 != (uint)uVar49) &&
                        (bVar65 = uVar58 != uVar47, uVar58 = uVar58 + 1, uVar21 = uVar47 + 1, bVar65
                        ));
LAB_0018eba6:
                iVar26 = uVar21 - 1;
              }
              sqlite3VdbeAddOp3(pVVar5,7,psVar9->idxNum,iVar25,0);
              sqlite3VdbeAddOp3(pVVar5,7,iVar26,iVar25 + 1,0);
              pcVar35 = psVar9->idxStr;
              iVar26 = psVar9->needToFreeIdxStr;
              iVar39 = sqlite3VdbeAddOp3(pVVar5,0x88,iVar20,iVar39,iVar25);
              sqlite3VdbeChangeP4(pVVar5,iVar39,pcVar35,(uint)(iVar26 == 0) * 9 + -0xb);
              psVar9->needToFreeIdxStr = 0;
              if (0 < (int)uVar47) {
                piVar33 = &psVar11->iTermOffset;
                uVar49 = 0;
                do {
                  if (psVar10[uVar49].omit != '\0') {
                    disableTerm(pWVar48,pWVar60->a + *piVar33);
                  }
                  uVar49 = uVar49 + 1;
                  piVar33 = piVar33 + 3;
                } while (uVar47 != uVar49);
              }
              pWVar48->op = 0x8a;
              pWVar48->p1 = iVar20;
              pWVar48->p2 = pVVar5->nOp;
              iVar39 = iVar25;
              sqlite3ExprCacheRemove(pParse_00,iVar25,iVar61);
              if (pParse_00->nRangeReg < iVar61) {
                pParse_00->nRangeReg = iVar61;
                pParse_00->iRangeReg = iVar25;
              }
              sqlite3ExprCachePop(pParse_00,iVar39);
              local_1d0._0_4_ = 0;
              goto LAB_0018ecca;
            }
            if ((uVar58 >> 0xc & 1) != 0) {
              if (pParse_00->nTempReg == '\0') {
                local_1d0._0_4_ = pParse_00->nMem + 1;
                pParse_00->nMem = local_1d0._0_4_;
              }
              else {
                bVar57 = pParse_00->nTempReg - 1;
                pParse_00->nTempReg = bVar57;
                local_1d0._0_4_ = pParse_00->aTempReg[bVar57];
              }
              pWVar29 = findTerm(pWVar60,iVar20,-1,uVar62,3,(Index *)0x0);
              iVar25 = codeEqualityTerm(pParse_00,pWVar29,pWVar48,0,local_1d0._0_4_);
              iVar61 = pWVar48->addrNxt;
              sqlite3VdbeAddOp3(pVVar5,0x15,iVar25,iVar61,0);
              sqlite3VdbeAddOp3(pVVar5,0x36,iVar20,iVar61,iVar25);
              sqlite3ExprCacheRemove(pParse_00,iVar25,1);
              sqlite3ExprCacheStore(pParse_00,iVar20,-1,iVar25);
              pWVar48->op = 0x95;
              goto LAB_0018ecca;
            }
            uVar21 = uVar47 & 0x1000000;
            if ((uVar58 >> 0xd & 1) != 0) {
              pWVar34 = findTerm(pWVar60,iVar20,-1,uVar62,0x24,(Index *)0x0);
              pWVar29 = findTerm(pWVar60,iVar20,-1,uVar62,0x18,(Index *)0x0);
              pWVar42 = pWVar34;
              if (uVar21 != 0) {
                pWVar42 = pWVar29;
                pWVar29 = pWVar34;
              }
              if (pWVar42 == (WhereTerm *)0x0) {
                sqlite3VdbeAddOp3(pVVar5,(uint)(uVar21 == 0) * 5 + 0x43,iVar20,iVar61,0);
                if (pWVar29 == (WhereTerm *)0x0) {
                  iVar61 = pVVar5->nOp;
                  pWVar48->op = (uVar21 == 0) * '\x03' + '\\';
                  pWVar48->p1 = iVar20;
                  pWVar48->p2 = iVar61;
                  goto LAB_0018f5bd;
                }
              }
              else {
                pEVar38 = pWVar42->pExpr;
                iVar25 = sqlite3ExprCodeTemp(pParse_00,pEVar38->pRight,(int *)&local_78);
                sqlite3VdbeAddOp3(pVVar5,(uint)*(byte *)((long)yy_reduce_ofst +
                                                        (ulong)pEVar38->op + 0x23b),iVar20,iVar61,
                                  iVar25);
                sqlite3ExprCacheRemove(pParse_00,iVar25,1);
                if (local_78._0_4_ != 0) {
                  bVar57 = pParse_00->nTempReg;
                  if ((ulong)bVar57 < 8) {
                    lVar40 = 0;
                    do {
                      if (*(int *)((long)&pParse_00->aColCache[0].iReg + lVar40) == local_78._0_4_)
                      {
                        (&pParse_00->aColCache[0].tempReg)[lVar40] = '\x01';
                        goto LAB_0018f531;
                      }
                      lVar40 = lVar40 + 0x18;
                    } while ((int)lVar40 != 0xf0);
                    pParse_00->nTempReg = bVar57 + 1;
                    pParse_00->aTempReg[bVar57] = local_78._0_4_;
                  }
                }
LAB_0018f531:
                disableTerm(pWVar48,pWVar42);
                if (pWVar29 == (WhereTerm *)0x0) {
                  iVar61 = pVVar5->nOp;
                  pWVar48->op = (uVar21 == 0) * '\x03' + '\\';
                  local_1d0._0_4_ = 0;
                  pWVar48->p1 = iVar20;
                  pWVar48->p2 = iVar61;
                  if (pWVar42 != (WhereTerm *)0x0) goto LAB_0018ecca;
LAB_0018f5bd:
                  pWVar48->p5 = '\x01';
                  local_1d0._0_4_ = 0;
                  goto LAB_0018ecca;
                }
              }
              pEVar38 = pWVar29->pExpr;
              iVar25 = pParse_00->nMem + 1;
              pParse_00->nMem = iVar25;
              sqlite3ExprCode(pParse_00,pEVar38->pRight,iVar25);
              if ((pEVar38->op | 2) == 0x4f) {
                iVar39 = (uint)(uVar21 == 0) * 2 + 0x4e;
              }
              else {
                iVar39 = (uint)(uVar21 != 0) * 2 + 0x4d;
              }
              disableTerm(pWVar48,pWVar29);
              iVar26 = pVVar5->nOp;
              pWVar48->op = (uVar21 == 0) * '\x03' + '\\';
              pWVar48->p1 = iVar20;
              pWVar48->p2 = iVar26;
              if (pParse_00->nTempReg == '\0') {
                local_1d0._0_4_ = pParse_00->nMem + 1;
                pParse_00->nMem = local_1d0._0_4_;
              }
              else {
                bVar57 = pParse_00->nTempReg - 1;
                pParse_00->nTempReg = bVar57;
                local_1d0._0_4_ = pParse_00->aTempReg[bVar57];
              }
              sqlite3VdbeAddOp3(pVVar5,0x41,iVar20,local_1d0._0_4_,0);
              sqlite3ExprCacheStore(pParse_00,iVar20,-1,local_1d0._0_4_);
              sqlite3VdbeAddOp3(pVVar5,iVar39,iVar25,iVar61,local_1d0._0_4_);
              if (pVVar5->aOp != (Op *)0x0) {
                pVVar5->aOp[(long)pVVar5->nOp + -1].p5 = 'k';
              }
              goto LAB_0018ecca;
            }
            uVar24 = (uVar47 & 0x1000000) >> 0x18;
            uVar49 = (ulong)uVar24;
            if ((uVar58 & 0x30000) != 0) {
              uVar3 = (pWVar48->plan).nEq;
              pIVar31 = (pWVar48->plan).u.pIdx;
              uVar4 = pIVar31->nColumn;
              iVar61 = -1;
              if (uVar3 != uVar4) {
                iVar61 = pIVar31->aiColumn[uVar3];
              }
              uVar22 = 0;
              bVar65 = true;
              if (((wctrlFlags & 1) != 0) && ((uVar58 & 0x800000) != 0)) {
                bVar65 = uVar4 <= uVar3;
                uVar22 = (uint)(uVar3 < uVar4);
              }
              iVar25 = pWVar48->iIdxCur;
              if ((uVar58 >> 0x14 & 1) == 0) {
                pWVar29 = (WhereTerm *)0x0;
              }
              else {
                pWVar29 = findTerm(pWVar60,iVar20,iVar61,uVar62,0x18,pIVar31);
                uVar58 = (pWVar48->plan).wsFlags;
                uVar22 = 1;
              }
              if ((uVar58 >> 0x15 & 1) == 0) {
                local_158 = (WhereTerm *)0x0;
              }
              else {
                local_158 = findTerm(pWVar60,iVar20,iVar61,uVar62,0x24,pIVar31);
                uVar22 = 1;
              }
              iVar39 = codeAllEqualityTerms
                                 (pParse_00,pWVar48,pWVar60,uVar62,uVar22,(char **)&local_78);
              zAff = local_78._0_8_;
              pcVar35 = sqlite3DbStrDup(pParse_00->db,(char *)local_78._0_8_);
              iVar61 = pWVar48->addrNxt;
              pWVar42 = pWVar29;
              if (uVar3 < pIVar31->nColumn) {
                if (uVar24 != (pIVar31->aSortOrder[uVar3] == '\0')) {
LAB_0018f2c8:
                  pWVar42 = local_158;
                  local_158 = pWVar29;
                }
              }
              else if ((uVar21 == 0) || (pIVar31->nColumn != uVar3)) goto LAB_0018f2c8;
              uVar58 = 1;
              uVar22 = 1;
              if (pWVar42 != (WhereTerm *)0x0) {
                uVar22 = (uint)((pWVar42->eOperator & 0x28) != 0);
              }
              if (local_158 != (WhereTerm *)0x0) {
                uVar58 = (uint)((local_158->eOperator & 0x28) != 0);
              }
              uVar44 = (uint)uVar3;
              uVar71 = (uint)uVar3;
              if (pWVar42 == (WhereTerm *)0x0) {
                if (!bVar65) {
                  uVar22 = 0;
                  sqlite3VdbeAddOp3(pVVar5,10,0,iVar39 + uVar71,0);
                  goto LAB_0018f7e1;
                }
                codeApplyAffinity(pParse_00,iVar39,uVar71,(char *)zAff);
                iVar26 = (uint)(uVar44 != 0 || pWVar42 != (WhereTerm *)0x0) << 2;
                uVar74 = uVar71;
              }
              else {
                pEVar38 = pWVar42->pExpr->pRight;
                sqlite3ExprCode(pParse_00,pEVar38,iVar39 + uVar44);
                sqlite3ExprCodeIsNullJump(pVVar5,pEVar38,iVar39 + uVar44,iVar61);
                if ((_func_int_Walker_ptr_Expr_ptr *)zAff != (_func_int_Walker_ptr_Expr_ptr *)0x0) {
                  aff2 = *(_func_int_Walker_ptr_Expr_ptr *)(zAff + (ulong)uVar3);
                  cVar16 = sqlite3CompareAffinity(pEVar38,(char)aff2);
                  if (cVar16 == 'b') {
                    *(code *)(zAff + (ulong)uVar3) = (code)0x62;
                    aff2 = (code)0x62;
                  }
                  iVar26 = sqlite3ExprNeedsNoAffinityChange(pEVar38,(char)aff2);
                  if (iVar26 != 0) {
                    *(code *)(zAff + (ulong)uVar3) = (code)0x62;
                  }
                }
LAB_0018f7e1:
                codeApplyAffinity(pParse_00,iVar39,uVar71 + 1,(char *)zAff);
                iVar26 = 4;
                uVar74 = uVar71 + 1;
              }
              sqlite3VdbeAddOp4Int
                        (pVVar5,(uint)*(byte *)((long)&codeOneLoopStart_aStartOp +
                                               (ulong)(iVar26 + uVar22 * 2 | uVar24)),iVar25,iVar61,
                         iVar39,uVar74);
              if (local_158 != (WhereTerm *)0x0) {
                pEVar38 = local_158->pExpr->pRight;
                iVar26 = iVar39 + uVar71;
                sqlite3ExprCacheRemove(pParse_00,iVar26,1);
                sqlite3ExprCode(pParse_00,pEVar38,iVar26);
                sqlite3ExprCodeIsNullJump(pVVar5,pEVar38,iVar26,iVar61);
                if (pcVar35 != (char *)0x0) {
                  cVar16 = pcVar35[uVar3];
                  cVar17 = sqlite3CompareAffinity(pEVar38,cVar16);
                  if (cVar17 == 'b') {
                    pcVar35[uVar3] = 'b';
                    cVar16 = 'b';
                  }
                  iVar26 = sqlite3ExprNeedsNoAffinityChange(pEVar38,cVar16);
                  if (iVar26 != 0) {
                    pcVar35[uVar3] = 'b';
                  }
                }
                uVar44 = uVar3 + 1;
                codeApplyAffinity(pParse_00,iVar39,uVar44,pcVar35);
              }
              sqlite3DbFree(pParse_00->db,(void *)zAff);
              sqlite3DbFree(pParse_00->db,pcVar35);
              pWVar48->p2 = pVVar5->nOp;
              if ((uVar3 != 0) || (local_158 != (WhereTerm *)0x0)) {
                sqlite3VdbeAddOp4Int
                          (pVVar5,(uint)*(byte *)((long)&codeOneLoopStart_aEndOp + uVar49 + 1),
                           iVar25,iVar61,iVar39,uVar44);
                if (pVVar5->aOp != (Op *)0x0) {
                  pVVar5->aOp[(long)pVVar5->nOp + -1].p5 = uVar58 != uVar24;
                }
              }
              if (pParse_00->nTempReg == '\0') {
                iVar61 = pParse_00->nMem + 1;
                pParse_00->nMem = iVar61;
              }
              else {
                bVar57 = pParse_00->nTempReg - 1;
                pParse_00->nTempReg = bVar57;
                iVar61 = pParse_00->aTempReg[bVar57];
              }
              if (((pWVar48->plan).wsFlags & 0x300000) != 0) {
                sqlite3VdbeAddOp3(pVVar5,0x1d,iVar25,(uint)uVar3,iVar61);
                sqlite3VdbeAddOp3(pVVar5,0x49,iVar61,iVar23,0);
              }
              if (iVar61 != 0) {
                bVar57 = pParse_00->nTempReg;
                if ((ulong)bVar57 < 8) {
                  lVar40 = 0;
                  do {
                    if (*(int *)((long)&pParse_00->aColCache[0].iReg + lVar40) == iVar61) {
                      (&pParse_00->aColCache[0].tempReg)[lVar40] = '\x01';
                      goto LAB_0018fa8f;
                    }
                    lVar40 = lVar40 + 0x18;
                  } while ((int)lVar40 != 0xf0);
                  pParse_00->nTempReg = bVar57 + 1;
                  pParse_00->aTempReg[bVar57] = iVar61;
                }
              }
LAB_0018fa8f:
              disableTerm(pWVar48,pWVar42);
              disableTerm(pWVar48,local_158);
              local_1d0._0_4_ = 0;
              if (((wctrlFlags & 0x20) == 0 & (byte)(uVar47 >> 0x16) & 1) == 0) {
                if (pParse_00->nTempReg == '\0') {
                  local_1d0._0_4_ = pParse_00->nMem + 1;
                  pParse_00->nMem = local_1d0._0_4_;
                }
                else {
                  bVar57 = pParse_00->nTempReg - 1;
                  pParse_00->nTempReg = bVar57;
                  local_1d0._0_4_ = pParse_00->aTempReg[bVar57];
                }
                sqlite3VdbeAddOp3(pVVar5,99,iVar25,local_1d0._0_4_,0);
                sqlite3ExprCacheStore(pParse_00,iVar20,-1,local_1d0._0_4_);
                sqlite3VdbeAddOp3(pVVar5,0x32,iVar20,local_1d0._0_4_,0);
              }
              uVar47 = (pWVar48->plan).wsFlags;
              uVar18 = (uVar21 == 0) * '\x03' + '\\';
              if ((uVar47 >> 0x19 & 1) != 0) {
                uVar18 = 0x95;
              }
              pWVar48->op = uVar18;
              pWVar48->p1 = iVar25;
              if ((int)uVar47 < 0) {
                pWVar48->p5 = '\x01';
              }
              goto LAB_0018ecca;
            }
            if ((uVar58 >> 0x1c & 1) == 0) {
              pWVar48->op = *(u8 *)((long)&codeOneLoopStart_aStep + uVar49);
              pWVar48->p1 = iVar20;
              local_1d0._0_4_ = 0;
              iVar61 = sqlite3VdbeAddOp3(pVVar5,(uint)*(byte *)((long)&codeOneLoopStart_aStart +
                                                               uVar49),iVar20,iVar61,0);
              pWVar48->p2 = iVar61 + 1;
              pWVar48->p5 = '\x01';
              goto LAB_0018ecca;
            }
            iVar61 = pParse_00->nTab;
            pParse_00->nTab = iVar61 + 1;
            iVar26 = pParse_00->nMem + 1;
            pParse_00->nMem = iVar26;
            uVar47 = sqlite3VdbeMakeLabel(pVVar5);
            pIVar31 = (pWVar48->plan).u.pIdx;
            ptVar12 = pIVar31->aiRowEst;
            pWVar48->op = '\x03';
            pWVar48->p1 = iVar26;
            iVar39 = pWInfo->nLevel;
            if (iVar39 < 2) {
              local_1a8 = pWInfo->pTabList;
LAB_0018f6ae:
              iVar39 = 0;
              iVar27 = 0;
              if ((wctrlFlags & 8) == 0) {
                iVar39 = pParse_00->nMem + 1;
                iVar27 = pParse_00->nMem + 2;
                pParse_00->nMem = iVar27;
                sqlite3VdbeAddOp3(pVVar5,10,0,iVar39,0);
              }
              uVar58 = sqlite3VdbeAddOp3(pVVar5,7,0,iVar26,0);
              iVar28 = pWVar60->nTerm;
              if (iVar28 < 2) {
                pEVar38 = (Expr *)0x0;
              }
              else {
                lVar59 = 0x1a;
                lVar40 = 0;
                pEVar38 = (Expr *)0x0;
                do {
                  pWVar29 = pWVar60->a;
                  pEVar37 = *(Expr **)((long)pWVar29 + lVar59 + -0x1a);
                  if ((((pEVar37->flags & 1) == 0) &&
                      ((*(byte *)((long)&pWVar29->pExpr + lVar59) & 0x12) == 0)) &&
                     ((*(ushort *)((long)pWVar29 + lVar59 + -2) & 0xfff) != 0)) {
                    pEVar37 = exprDup(pParse_00->db,pEVar37,0,(u8 **)0x0);
                    pEVar38 = sqlite3ExprAnd(pParse_00->db,pEVar38,pEVar37);
                    iVar28 = pWVar60->nTerm;
                  }
                  lVar40 = lVar40 + 1;
                  lVar59 = lVar59 + 0x38;
                } while (lVar40 < iVar28);
                if (pEVar38 == (Expr *)0x0) {
                  pEVar38 = (Expr *)0x0;
                }
                else {
                  pEVar38 = sqlite3PExpr(pParse_00,0x45,(Expr *)0x0,pEVar38,(Token *)0x0);
                }
              }
              if ((int)ptVar12[7] < 1) {
                (pWVar48->u).pCovidx = (Index *)0x0;
                bVar65 = true;
              }
              else {
                lVar40 = 0;
                uVar49 = 0;
                bVar65 = false;
                local_188 = (Index *)0x0;
                do {
                  lVar59 = *(long *)(ptVar12 + 10);
                  if ((*(int *)(lVar59 + 0xc + lVar40) == iVar20) ||
                     ((*(byte *)(lVar59 + 0x19 + lVar40) & 2) != 0)) {
                    pEVar37 = *(Expr **)(lVar59 + lVar40);
                    if ((pEVar38 != (Expr *)0x0) && ((pEVar37->flags & 1) == 0)) {
                      pEVar38->pLeft = pEVar37;
                      pEVar37 = pEVar38;
                    }
                    pWInfo_00 = sqlite3WhereBegin(pParse_00,local_1a8,pEVar37,(ExprList *)0x0,
                                                  (ExprList *)0x0,0xf0,iVar61);
                    if (pWInfo_00 != (WhereInfo *)0x0) {
                      explainOneScan(pParse_00,local_1a8,pWInfo_00->a,iVar25,(uint)pWVar48->iFrom,0)
                      ;
                      if ((wctrlFlags & 8) == 0) {
                        iVar28 = (int)uVar49;
                        if (uVar49 == ptVar12[7] - 1) {
                          iVar28 = -1;
                        }
                        p3 = sqlite3ExprCodeGetColumn
                                       (pParse_00,pSVar8->a[bVar57].pTab,-1,iVar20,iVar27,'\0');
                        sqlite3VdbeAddOp4Int(pVVar5,0x72,iVar39,pVVar5->nOp + 2,p3,iVar28);
                      }
                      sqlite3VdbeAddOp3(pVVar5,2,iVar26,uVar47,0);
                      if (pWInfo_00->untestedTerms != '\0') {
                        bVar65 = true;
                      }
                      uVar21 = pWInfo_00->a[0].plan.wsFlags;
                      if (((byte)(uVar21 >> 0x1d) & 1) == 0 && (uVar21 & 0xf0000) != 0) {
                        pIVar63 = pWInfo_00->a[0].plan.u.pIdx;
                        if ((lVar40 != 0) && (pIVar63 != local_188)) {
                          pIVar63 = (Index *)0x0;
                        }
                      }
                      else {
                        pIVar63 = (Index *)0x0;
                      }
                      sqlite3WhereEnd(pWInfo_00);
                      local_188 = pIVar63;
                    }
                  }
                  uVar49 = uVar49 + 1;
                  lVar40 = lVar40 + 0x38;
                } while ((long)uVar49 < (long)(int)ptVar12[7]);
                bVar65 = !bVar65;
                (pWVar48->u).pCovidx = local_188;
                if (local_188 != (Index *)0x0) {
                  pWVar48->iIdxCur = iVar61;
                }
              }
              if (pEVar38 != (Expr *)0x0) {
                pEVar38->pLeft = (Expr *)0x0;
                sqlite3ExprDelete(pParse_00->db,pEVar38);
              }
              if (uVar58 < (uint)pVVar5->nOp) {
                pVVar5->aOp[uVar58].p1 = pVVar5->nOp;
              }
              sqlite3VdbeAddOp3(pVVar5,1,0,pWVar48->addrBrk,0);
              if (pVVar5->aLabel != (int *)0x0) {
                pVVar5->aLabel[(int)~uVar47] = pVVar5->nOp;
              }
              if (1 < pWInfo->nLevel) {
                sqlite3DbFree(pParse_00->db,local_1a8);
              }
              local_1d0._0_4_ = 0;
              if (bVar65) {
                disableTerm(pWVar48,(WhereTerm *)pIVar31);
              }
              goto LAB_0018ecca;
            }
            iVar27 = iVar39 - iVar25;
            local_1a8 = (SrcList *)sqlite3DbMallocRaw(pParse_00->db,iVar27 * 0x68 + 8);
            if (local_1a8 != (SrcList *)0x0) {
              local_1a8->nAlloc = (i16)iVar27;
              local_1a8->nSrc = (i16)iVar27;
              pSVar52 = pSVar8->a + bVar57;
              pSVar54 = local_1a8->a;
              for (lVar40 = 0xd; lVar40 != 0; lVar40 = lVar40 + -1) {
                pSVar54->pSchema = pSVar52->pSchema;
                pSVar52 = (SrcList_item *)((long)pSVar52 + ((ulong)bVar66 * -2 + 1) * 8);
                pSVar54 = (SrcList_item *)((long)pSVar54 + (ulong)bVar66 * -0x10 + 8);
              }
              if (1 < iVar27) {
                pSVar13 = pWInfo->pTabList;
                pSVar36 = local_1a8 + 1;
                lVar40 = (ulong)(uint)(iVar39 + iVar50) - 1;
                pbVar56 = pbVar46;
                do {
                  pSVar52 = pSVar13->a + *pbVar56;
                  pSVar55 = pSVar36;
                  for (lVar59 = 0xd; lVar59 != 0; lVar59 = lVar59 + -1) {
                    *(Schema **)pSVar55 = pSVar52->pSchema;
                    pSVar52 = (SrcList_item *)((long)pSVar52 + (ulong)bVar66 * -0x10 + 8);
                    pSVar55 = (SrcList *)((long)pSVar55 + (ulong)bVar66 * -0x10 + 8);
                  }
                  pSVar36 = (SrcList *)&pSVar36->a[0].pIndex;
                  pbVar56 = pbVar56 + 0x60;
                  lVar40 = lVar40 + -1;
                } while (lVar40 != 0);
              }
              goto LAB_0018f6ae;
            }
          }
          else {
            iVar25 = pSVar8->a[bVar57].regReturn;
            local_1d0._0_4_ = 0;
            sqlite3VdbeAddOp3(pVVar5,7,pSVar8->a[bVar57].addrFillSub + -1,iVar25,0);
            iVar39 = sqlite3VdbeAddOp3(pVVar5,4,iVar25,0,0);
            pWVar48->p2 = iVar39;
            sqlite3VdbeAddOp3(pVVar5,0x1b,iVar25 + 1,iVar61,0);
            pWVar48->op = '\x01';
LAB_0018ecca:
            lVar40 = (long)pWVar60->pMaskSet->n;
            uVar49 = 0xffffffffffffffff;
            if (0 < lVar40) {
              lVar59 = 0;
              do {
                if (pWVar60->pMaskSet->ix[lVar59] == iVar20) {
                  bVar57 = (byte)lVar59 & 0x3f;
                  uVar49 = -2L << bVar57 | 0xfffffffffffffffeU >> 0x40 - bVar57;
                  break;
                }
                lVar59 = lVar59 + 1;
              } while (lVar40 != lVar59);
            }
            uVar49 = uVar49 & uVar62;
            if (0 < pWVar60->nTerm) {
              pWVar29 = pWVar60->a;
              iVar61 = pWVar60->nTerm + 1;
              do {
                if ((pWVar29->wtFlags & 6) == 0) {
                  if ((pWVar29->prereqAll & uVar49) == 0) {
                    if ((pWVar48->iLeftJoin == 0) || ((pWVar29->pExpr->flags & 1) != 0)) {
                      sqlite3ExprIfFalse(pParse_00,pWVar29->pExpr,iVar23,8);
                      pWVar29->wtFlags = pWVar29->wtFlags | 4;
                    }
                  }
                  else {
                    pWInfo->untestedTerms = '\x01';
                  }
                }
                pWVar29 = pWVar29 + 1;
                iVar61 = iVar61 + -1;
              } while (1 < iVar61);
              if (0 < pWVar60->nTerm) {
                iVar61 = pWVar60->nTerm + 1;
                puVar64 = &pWVar60->a->wtFlags;
                do {
                  if ((((*puVar64 & 6) == 0) && (*(u16 *)(puVar64 + -2) == 0x402)) &&
                     (*(int *)(puVar64 + -0xe) == iVar20)) {
                    pEVar38 = ((WhereTerm *)(puVar64 + -0x1a))->pExpr;
                    pWVar29 = findTerm(pWVar60,iVar20,
                                       ((anon_union_8_3_737c4e49_for_u *)(puVar64 + -10))->
                                       leftColumn,uVar62,3,(Index *)0x0);
                    if ((pWVar29 != (WhereTerm *)0x0) && ((pWVar29->wtFlags & 4) == 0)) {
                      pEVar37 = pWVar29->pExpr;
                      pEVar53 = &local_78;
                      for (lVar40 = 9; lVar40 != 0; lVar40 = lVar40 + -1) {
                        cVar16 = pEVar37->affinity;
                        uVar19 = pEVar37->flags;
                        uVar15 = *(undefined4 *)&pEVar37->field_0x4;
                        pEVar53->op = pEVar37->op;
                        pEVar53->affinity = cVar16;
                        pEVar53->flags = uVar19;
                        *(undefined4 *)&pEVar53->field_0x4 = uVar15;
                        pEVar37 = (Expr *)((long)pEVar37 + ((ulong)bVar66 * -2 + 1) * 8);
                        pEVar53 = (Expr *)((long)pEVar53 + (ulong)bVar66 * -0x10 + 8);
                      }
                      local_78.pLeft = pEVar38->pLeft;
                      sqlite3ExprIfFalse(pParse_00,&local_78,iVar23,8);
                    }
                  }
                  iVar61 = iVar61 + -1;
                  puVar64 = puVar64 + 0x38;
                } while (1 < iVar61);
              }
            }
            if (pWVar48->iLeftJoin != 0) {
              pWVar48->addrFirst = pVVar5->nOp;
              sqlite3VdbeAddOp3(pVVar5,7,1,pWVar48->iLeftJoin,0);
              sqlite3ExprCacheClear(pParse_00);
              iVar20 = pWVar60->nTerm;
              if (0 < iVar20) {
                pWVar29 = pWVar60->a;
                iVar61 = 0;
                do {
                  if (((pWVar29->wtFlags & 6) == 0) && ((pWVar29->prereqAll & uVar49) == 0)) {
                    sqlite3ExprIfFalse(pParse_00,pWVar29->pExpr,iVar23,8);
                    pWVar29->wtFlags = pWVar29->wtFlags | 4;
                    iVar20 = pWVar60->nTerm;
                  }
                  iVar61 = iVar61 + 1;
                  pWVar29 = pWVar29 + 1;
                } while (iVar61 < iVar20);
              }
            }
            uVar62 = uVar49;
            if (local_1d0._0_4_ != 0) {
              bVar57 = pParse_00->nTempReg;
              if ((ulong)bVar57 < 8) {
                lVar40 = 0;
                do {
                  if (*(int *)((long)&pParse_00->aColCache[0].iReg + lVar40) == local_1d0._0_4_) {
                    (&pParse_00->aColCache[0].tempReg)[lVar40] = '\x01';
                    goto LAB_0018fb9d;
                  }
                  lVar40 = lVar40 + 0x18;
                } while ((int)lVar40 != 0xf0);
                pParse_00->nTempReg = bVar57 + 1;
                pParse_00->aTempReg[bVar57] = local_1d0._0_4_;
              }
            }
          }
LAB_0018fb9d:
          pWInfo->iContinue = pWVar48->addrCont;
          uVar43 = uVar43 + 1;
          iVar50 = iVar50 + -1;
          pbVar46 = pbVar46 + 0x60;
          if (uVar43 == uVar14) {
            return pWInfo;
          }
        } while( true );
      }
    }
  }
LAB_0018dee2:
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return (WhereInfo *)0x0;
LAB_0018d917:
  pWInfo->eDistinct = '\x01';
  pDistinct = (ExprList *)0x0;
  goto LAB_0018d927;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,        /* The parser context */
  SrcList *pTabList,    /* A list of all tables to be scanned */
  Expr *pWhere,         /* The WHERE clause */
  ExprList *pOrderBy,   /* An ORDER BY clause, or NULL */
  ExprList *pDistinct,  /* The select-list for DISTINCT queries - or NULL */
  u16 wctrlFlags,       /* One of the WHERE_* flags defined in sqliteInt.h */
  int iIdxCur           /* If WHERE_ONETABLE_ONLY is set, index cursor number */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereBestIdx sWBI;         /* Best index search context */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  int iFrom;                 /* First unused FROM clause element */
  int andFlags;              /* AND-ed combination of all pWC->a[].wtFlags */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */


  /* Variable initialization */
  memset(&sWBI, 0, sizeof(sWBI));
  sWBI.pParse = pParse;

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_ONETABLE_ONLY flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_ONETABLE_ONLY) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  db = pParse->db;
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocZero(db, 
      nByteWInfo + 
      sizeof(WhereClause) +
      sizeof(WhereMaskSet)
  );
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->nLevel = nTabList;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->iBreak = sqlite3VdbeMakeLabel(v);
  pWInfo->pWC = sWBI.pWC = (WhereClause *)&((u8 *)pWInfo)[nByteWInfo];
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pMaskSet = (WhereMaskSet*)&sWBI.pWC[1];
  sWBI.aLevel = pWInfo->a;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ) pDistinct = 0;

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  whereClauseInit(sWBI.pWC, pParse, pMaskSet, wctrlFlags);
  sqlite3ExprCodeConstants(pParse, pWhere);
  whereSplit(sWBI.pWC, pWhere, TK_AND);   /* IMP: R-15842-53296 */
    
  /* Special case: a WHERE clause that is constant.  Evaluate the
  ** expression and either jump over all of the code or fall thru.
  */
  if( pWhere && (nTabList==0 || sqlite3ExprIsConstantNotJoin(pWhere)) ){
    sqlite3ExprIfFalse(pParse, pWhere, pWInfo->iBreak, SQLITE_JUMPIFNULL);
    pWhere = 0;
  }

  /* Assign a bit from the bitmask to every term in the FROM clause.
  **
  ** When assigning bitmask values to FROM clause cursors, it must be
  ** the case that if X is the bitmask for the N-th FROM clause term then
  ** the bitmask for all FROM clause terms to the left of the N-th term
  ** is (X-1).   An expression from the ON clause of a LEFT JOIN can use
  ** its Expr.iRightJoinTable value to find the bitmask of the right table
  ** of the join.  Subtracting one from the right table bitmask gives a
  ** bitmask for all tables to the left of the join.  Knowing the bitmask
  ** for all tables to the left of a left join is important.  Ticket #3015.
  **
  ** Note that bitmasks are created for all pTabList->nSrc tables in
  ** pTabList, not just the first nTabList tables.  nTabList is normally
  ** equal to pTabList->nSrc but might be shortened to 1 if the
  ** WHERE_ONETABLE_ONLY flag is set.
  */
  for(ii=0; ii<pTabList->nSrc; ii++){
    createMask(pMaskSet, pTabList->a[ii].iCursor);
  }
#ifndef NDEBUG
  {
    Bitmask toTheLeft = 0;
    for(ii=0; ii<pTabList->nSrc; ii++){
      Bitmask m = getMask(pMaskSet, pTabList->a[ii].iCursor);
      assert( (m-1)==toTheLeft );
      toTheLeft |= m;
    }
  }
#endif

  /* Analyze all of the subexpressions.  Note that exprAnalyze() might
  ** add new virtual terms onto the end of the WHERE clause.  We do not
  ** want to analyze these virtual terms, so start analyzing at the end
  ** and work forward so that the added virtual terms are never processed.
  */
  exprAnalyzeAll(pTabList, sWBI.pWC);
  if( db->mallocFailed ){
    goto whereBeginError;
  }

  /* Check if the DISTINCT qualifier, if there is one, is redundant. 
  ** If it is, then set pDistinct to NULL and WhereInfo.eDistinct to
  ** WHERE_DISTINCT_UNIQUE to tell the caller to ignore the DISTINCT.
  */
  if( pDistinct && isDistinctRedundant(pParse, pTabList, sWBI.pWC, pDistinct) ){
    pDistinct = 0;
    pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
  }

  /* Chose the best index to use for each table in the FROM clause.
  **
  ** This loop fills in the following fields:
  **
  **   pWInfo->a[].pIdx      The index to use for this level of the loop.
  **   pWInfo->a[].wsFlags   WHERE_xxx flags associated with pIdx
  **   pWInfo->a[].nEq       The number of == and IN constraints
  **   pWInfo->a[].iFrom     Which term of the FROM clause is being coded
  **   pWInfo->a[].iTabCur   The VDBE cursor for the database table
  **   pWInfo->a[].iIdxCur   The VDBE cursor for the index
  **   pWInfo->a[].pTerm     When wsFlags==WO_OR, the OR-clause term
  **
  ** This loop also figures out the nesting order of tables in the FROM
  ** clause.
  */
  sWBI.notValid = ~(Bitmask)0;
  sWBI.pOrderBy = pOrderBy;
  sWBI.n = nTabList;
  sWBI.pDistinct = pDistinct;
  andFlags = ~0;
  WHERETRACE(("*** Optimizer Start ***\n"));
  for(sWBI.i=iFrom=0, pLevel=pWInfo->a; sWBI.i<nTabList; sWBI.i++, pLevel++){
    WhereCost bestPlan;         /* Most efficient plan seen so far */
    Index *pIdx;                /* Index for FROM table at pTabItem */
    int j;                      /* For looping over FROM tables */
    int bestJ = -1;             /* The value of j */
    Bitmask m;                  /* Bitmask value for j or bestJ */
    int isOptimal;              /* Iterator for optimal/non-optimal search */
    int ckOptimal;              /* Do the optimal scan check */
    int nUnconstrained;         /* Number tables without INDEXED BY */
    Bitmask notIndexed;         /* Mask of tables that cannot use an index */

    memset(&bestPlan, 0, sizeof(bestPlan));
    bestPlan.rCost = SQLITE_BIG_DBL;
    WHERETRACE(("*** Begin search for loop %d ***\n", sWBI.i));

    /* Loop through the remaining entries in the FROM clause to find the
    ** next nested loop. The loop tests all FROM clause entries
    ** either once or twice. 
    **
    ** The first test is always performed if there are two or more entries
    ** remaining and never performed if there is only one FROM clause entry
    ** to choose from.  The first test looks for an "optimal" scan.  In
    ** this context an optimal scan is one that uses the same strategy
    ** for the given FROM clause entry as would be selected if the entry
    ** were used as the innermost nested loop.  In other words, a table
    ** is chosen such that the cost of running that table cannot be reduced
    ** by waiting for other tables to run first.  This "optimal" test works
    ** by first assuming that the FROM clause is on the inner loop and finding
    ** its query plan, then checking to see if that query plan uses any
    ** other FROM clause terms that are sWBI.notValid.  If no notValid terms
    ** are used then the "optimal" query plan works.
    **
    ** Note that the WhereCost.nRow parameter for an optimal scan might
    ** not be as small as it would be if the table really were the innermost
    ** join.  The nRow value can be reduced by WHERE clause constraints
    ** that do not use indices.  But this nRow reduction only happens if the
    ** table really is the innermost join.  
    **
    ** The second loop iteration is only performed if no optimal scan
    ** strategies were found by the first iteration. This second iteration
    ** is used to search for the lowest cost scan overall.
    **
    ** Without the optimal scan step (the first iteration) a suboptimal
    ** plan might be chosen for queries like this:
    **   
    **   CREATE TABLE t1(a, b); 
    **   CREATE TABLE t2(c, d);
    **   SELECT * FROM t2, t1 WHERE t2.rowid = t1.a;
    **
    ** The best strategy is to iterate through table t1 first. However it
    ** is not possible to determine this with a simple greedy algorithm.
    ** Since the cost of a linear scan through table t2 is the same 
    ** as the cost of a linear scan through table t1, a simple greedy 
    ** algorithm may choose to use t2 for the outer loop, which is a much
    ** costlier approach.
    */
    nUnconstrained = 0;
    notIndexed = 0;

    /* The optimal scan check only occurs if there are two or more tables
    ** available to be reordered */
    if( iFrom==nTabList-1 ){
      ckOptimal = 0;  /* Common case of just one table in the FROM clause */
    }else{
      ckOptimal = -1;
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          if( j==iFrom ) iFrom++;
          continue;
        }
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ) break;
        if( ++ckOptimal ) break;
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( ckOptimal==0 || ckOptimal==1 );

    for(isOptimal=ckOptimal; isOptimal>=0 && bestJ<0; isOptimal--){
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ){
          /* This break and one like it in the ckOptimal computation loop
          ** above prevent table reordering across LEFT and CROSS JOINs.
          ** The LEFT JOIN case is necessary for correctness.  The prohibition
          ** against reordering across a CROSS JOIN is an SQLite feature that
          ** allows the developer to control table reordering */
          break;
        }
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          assert( j>iFrom );
          continue;
        }
        sWBI.notReady = (isOptimal ? m : sWBI.notValid);
        if( sWBI.pSrc->pIndex==0 ) nUnconstrained++;
  
        WHERETRACE(("   === trying table %d (%s) with isOptimal=%d ===\n",
                    j, sWBI.pSrc->pTab->zName, isOptimal));
        assert( sWBI.pSrc->pTab );
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(sWBI.pSrc->pTab) ){
          sWBI.ppIdxInfo = &pWInfo->a[j].pIdxInfo;
          bestVirtualIndex(&sWBI);
        }else 
#endif
        {
          bestBtreeIndex(&sWBI);
        }
        assert( isOptimal || (sWBI.cost.used&sWBI.notValid)==0 );

        /* If an INDEXED BY clause is present, then the plan must use that
        ** index if it uses any index at all */
        assert( sWBI.pSrc->pIndex==0 
                  || (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0
                  || sWBI.cost.plan.u.pIdx==sWBI.pSrc->pIndex );

        if( isOptimal && (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0 ){
          notIndexed |= m;
        }
        if( isOptimal ){
          pWInfo->a[j].rOptCost = sWBI.cost.rCost;
        }else if( ckOptimal ){
          /* If two or more tables have nearly the same outer loop cost, but
          ** very different inner loop (optimal) cost, we want to choose
          ** for the outer loop that table which benefits the least from
          ** being in the inner loop.  The following code scales the 
          ** outer loop cost estimate to accomplish that. */
          WHERETRACE(("   scaling cost from %.1f to %.1f\n",
                      sWBI.cost.rCost,
                      sWBI.cost.rCost/pWInfo->a[j].rOptCost));
          sWBI.cost.rCost /= pWInfo->a[j].rOptCost;
        }

        /* Conditions under which this table becomes the best so far:
        **
        **   (1) The table must not depend on other tables that have not
        **       yet run.  (In other words, it must not depend on tables
        **       in inner loops.)
        **
        **   (2) (This rule was removed on 2012-11-09.  The scaling of the
        **       cost using the optimal scan cost made this rule obsolete.)
        **
        **   (3) All tables have an INDEXED BY clause or this table lacks an
        **       INDEXED BY clause or this table uses the specific
        **       index specified by its INDEXED BY clause.  This rule ensures
        **       that a best-so-far is always selected even if an impossible
        **       combination of INDEXED BY clauses are given.  The error
        **       will be detected and relayed back to the application later.
        **       The NEVER() comes about because rule (2) above prevents
        **       An indexable full-table-scan from reaching rule (3).
        **
        **   (4) The plan cost must be lower than prior plans, where "cost"
        **       is defined by the compareCost() function above. 
        */
        if( (sWBI.cost.used&sWBI.notValid)==0                    /* (1) */
            && (nUnconstrained==0 || sWBI.pSrc->pIndex==0        /* (3) */
                || NEVER((sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)!=0))
            && (bestJ<0 || compareCost(&sWBI.cost, &bestPlan))   /* (4) */
        ){
          WHERETRACE(("   === table %d (%s) is best so far\n"
                      "       cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=%08x\n",
                      j, sWBI.pSrc->pTab->zName,
                      sWBI.cost.rCost, sWBI.cost.plan.nRow,
                      sWBI.cost.plan.nOBSat, sWBI.cost.plan.wsFlags));
          bestPlan = sWBI.cost;
          bestJ = j;
        }

        /* In a join like "w JOIN x LEFT JOIN y JOIN z"  make sure that
        ** table y (and not table z) is always the next inner loop inside
        ** of table x. */
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( bestJ>=0 );
    assert( sWBI.notValid & getMask(pMaskSet, pTabList->a[bestJ].iCursor) );
    assert( bestJ==iFrom || (pTabList->a[iFrom].jointype & JT_LEFT)==0 );
    testcase( bestJ>iFrom && (pTabList->a[iFrom].jointype & JT_CROSS)!=0 );
    testcase( bestJ>iFrom && bestJ<nTabList-1
                          && (pTabList->a[bestJ+1].jointype & JT_LEFT)!=0 );
    WHERETRACE(("*** Optimizer selects table %d (%s) for loop %d with:\n"
                "    cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=0x%08x\n",
                bestJ, pTabList->a[bestJ].pTab->zName,
                pLevel-pWInfo->a, bestPlan.rCost, bestPlan.plan.nRow,
                bestPlan.plan.nOBSat, bestPlan.plan.wsFlags));
    if( (bestPlan.plan.wsFlags & WHERE_DISTINCT)!=0 ){
      assert( pWInfo->eDistinct==0 );
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
    andFlags &= bestPlan.plan.wsFlags;
    pLevel->plan = bestPlan.plan;
    pLevel->iTabCur = pTabList->a[bestJ].iCursor;
    testcase( bestPlan.plan.wsFlags & WHERE_INDEXED );
    testcase( bestPlan.plan.wsFlags & WHERE_TEMP_INDEX );
    if( bestPlan.plan.wsFlags & (WHERE_INDEXED|WHERE_TEMP_INDEX) ){
      if( (wctrlFlags & WHERE_ONETABLE_ONLY) 
       && (bestPlan.plan.wsFlags & WHERE_TEMP_INDEX)==0 
      ){
        pLevel->iIdxCur = iIdxCur;
      }else{
        pLevel->iIdxCur = pParse->nTab++;
      }
    }else{
      pLevel->iIdxCur = -1;
    }
    sWBI.notValid &= ~getMask(pMaskSet, pTabList->a[bestJ].iCursor);
    pLevel->iFrom = (u8)bestJ;
    if( bestPlan.plan.nRow>=(double)1 ){
      pParse->nQueryLoop *= bestPlan.plan.nRow;
    }

    /* Check that if the table scanned by this loop iteration had an
    ** INDEXED BY clause attached to it, that the named index is being
    ** used for the scan. If not, then query compilation has failed.
    ** Return an error.
    */
    pIdx = pTabList->a[bestJ].pIndex;
    if( pIdx ){
      if( (bestPlan.plan.wsFlags & WHERE_INDEXED)==0 ){
        sqlite3ErrorMsg(pParse, "cannot use index: %s", pIdx->zName);
        goto whereBeginError;
      }else{
        /* If an INDEXED BY clause is used, the bestIndex() function is
        ** guaranteed to find the index specified in the INDEXED BY clause
        ** if it find an index at all. */
        assert( bestPlan.plan.u.pIdx==pIdx );
      }
    }
  }
  WHERETRACE(("*** Optimizer Finished ***\n"));
  if( pParse->nErr || db->mallocFailed ){
    goto whereBeginError;
  }
  if( nTabList ){
    pLevel--;
    pWInfo->nOBSat = pLevel->plan.nOBSat;
  }else{
    pWInfo->nOBSat = 0;
  }

  /* If the total query only selects a single row, then the ORDER BY
  ** clause is irrelevant.
  */
  if( (andFlags & WHERE_UNIQUE)!=0 && pOrderBy ){
    assert( nTabList==0 || (pLevel->plan.wsFlags & WHERE_ALL_UNIQUE)!=0 );
    pWInfo->nOBSat = pOrderBy->nExpr;
  }

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  ** The one-pass algorithm only works if the WHERE clause constraints
  ** the statement to update a single row.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 && (andFlags & WHERE_UNIQUE)!=0 ){
    pWInfo->okOnePass = 1;
    pWInfo->a[0].plan.wsFlags &= ~WHERE_IDX_ONLY;
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  sqlite3CodeVerifySchema(pParse, -1); /* Insert the cookie verifier Goto */
  notReady = ~(Bitmask)0;
  pWInfo->nRowOut = (double)1;
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    pWInfo->nRowOut *= pLevel->plan.nRow;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLevel->plan.wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0 ){
      int op = pWInfo->okOnePass ? OP_OpenWrite : OP_OpenRead;
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      testcase( pTab->nCol==BMS-1 );
      testcase( pTab->nCol==BMS );
      if( !pWInfo->okOnePass && pTab->nCol<BMS ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, sqlite3VdbeCurrentAddr(v)-1, 
                            SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->plan.wsFlags & WHERE_TEMP_INDEX)!=0 ){
      constructAutomaticIndex(pParse, sWBI.pWC, pTabItem, notReady, pLevel);
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 ){
      Index *pIx = pLevel->plan.u.pIdx;
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIx);
      int iIndexCur = pLevel->iIdxCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      sqlite3VdbeAddOp4(v, OP_OpenRead, iIndexCur, pIx->tnum, iDb,
                        (char*)pKey, P4_KEYINFO_HANDOFF);
      VdbeComment((v, "%s", pIx->zName));
    }
    sqlite3CodeVerifySchema(pParse, iDb);
    notReady &= ~getMask(sWBI.pWC->pMaskSet, pTabItem->iCursor);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  notReady = ~(Bitmask)0;
  for(ii=0; ii<nTabList; ii++){
    pLevel = &pWInfo->a[ii];
    explainOneScan(pParse, pTabList, pLevel, ii, pLevel->iFrom, wctrlFlags);
    notReady = codeOneLoopStart(pWInfo, ii, wctrlFlags, notReady);
    pWInfo->iContinue = pLevel->addrCont;
  }

#ifdef SQLITE_TEST  /* For testing and debugging use only */
  /* Record in the query plan information about the current table
  ** and the index used to access it (if any).  If the table itself
  ** is not used, its name is just '{}'.  If no index is used
  ** the index is listed as "{}".  If the primary key is used the
  ** index name is '*'.
  */
  for(ii=0; ii<nTabList; ii++){
    char *z;
    int n;
    int w;
    struct SrcList_item *pTabItem;

    pLevel = &pWInfo->a[ii];
    w = pLevel->plan.wsFlags;
    pTabItem = &pTabList->a[pLevel->iFrom];
    z = pTabItem->zAlias;
    if( z==0 ) z = pTabItem->pTab->zName;
    n = sqlite3Strlen30(z);
    if( n+nQPlan < sizeof(sqlite3_query_plan)-10 ){
      if( (w & WHERE_IDX_ONLY)!=0 && (w & WHERE_COVER_SCAN)==0 ){
        memcpy(&sqlite3_query_plan[nQPlan], "{}", 2);
        nQPlan += 2;
      }else{
        memcpy(&sqlite3_query_plan[nQPlan], z, n);
        nQPlan += n;
      }
      sqlite3_query_plan[nQPlan++] = ' ';
    }
    testcase( w & WHERE_ROWID_EQ );
    testcase( w & WHERE_ROWID_RANGE );
    if( w & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      memcpy(&sqlite3_query_plan[nQPlan], "* ", 2);
      nQPlan += 2;
    }else if( (w & WHERE_INDEXED)!=0 && (w & WHERE_COVER_SCAN)==0 ){
      n = sqlite3Strlen30(pLevel->plan.u.pIdx->zName);
      if( n+nQPlan < sizeof(sqlite3_query_plan)-2 ){
        memcpy(&sqlite3_query_plan[nQPlan], pLevel->plan.u.pIdx->zName, n);
        nQPlan += n;
        sqlite3_query_plan[nQPlan++] = ' ';
      }
    }else{
      memcpy(&sqlite3_query_plan[nQPlan], "{} ", 3);
      nQPlan += 3;
    }
  }
  while( nQPlan>0 && sqlite3_query_plan[nQPlan-1]==' ' ){
    sqlite3_query_plan[--nQPlan] = 0;
  }
  sqlite3_query_plan[nQPlan] = 0;
  nQPlan = 0;
#endif /* SQLITE_TEST // Testing and debugging use only */

  /* Record the continuation address in the WhereInfo structure.  Then
  ** clean up and return.
  */
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}